

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginRegistry.cpp
# Opt level: O0

void Rml::PluginRegistry::RegisterPlugin(Plugin *plugin)

{
  uint uVar1;
  PluginVectors *pPVar2;
  Plugin *pPStack_10;
  int event_classes;
  Plugin *plugin_local;
  
  pPStack_10 = plugin;
  EnsurePluginVectorsInitialized();
  uVar1 = (*pPStack_10->_vptr_Plugin[2])();
  if ((uVar1 & 1) != 0) {
    pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                       ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
    ::std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>::push_back
              (&pPVar2->basic,&stack0xfffffffffffffff0);
  }
  if ((uVar1 & 2) != 0) {
    pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                       ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
    ::std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>::push_back
              (&pPVar2->document,&stack0xfffffffffffffff0);
  }
  if ((uVar1 & 4) != 0) {
    pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                       ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
    ::std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>::push_back
              (&pPVar2->element,&stack0xfffffffffffffff0);
  }
  return;
}

Assistant:

void PluginRegistry::RegisterPlugin(Plugin* plugin)
{
	EnsurePluginVectorsInitialized();

	int event_classes = plugin->GetEventClasses();

	if (event_classes & Plugin::EVT_BASIC)
		plugin_vectors->basic.push_back(plugin);
	if (event_classes & Plugin::EVT_DOCUMENT)
		plugin_vectors->document.push_back(plugin);
	if (event_classes & Plugin::EVT_ELEMENT)
		plugin_vectors->element.push_back(plugin);
}